

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatten_x86_avx.cpp
# Opt level: O2

int __thiscall
ncnn::Flatten_x86_avx::forward(Flatten_x86_avx *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined4 *puVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  uint uVar14;
  uint uVar15;
  int *piVar16;
  Allocator *pAVar17;
  void *pvVar18;
  void *pvVar19;
  size_t sVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [32];
  int iVar25;
  int iVar26;
  undefined4 *puVar27;
  ulong uVar28;
  ulong uVar29;
  long lVar30;
  int iVar31;
  Mat *pMVar32;
  long lVar33;
  long lVar34;
  undefined1 (*pauVar35) [32];
  uint uVar36;
  long lVar37;
  int iVar38;
  ulong uVar39;
  long lVar40;
  long lVar41;
  long lVar42;
  long lVar43;
  long lVar44;
  ulong uVar45;
  long lVar46;
  long lVar47;
  long lVar48;
  undefined1 (*pauVar49) [32];
  int iVar50;
  int iVar51;
  long lVar52;
  long lVar53;
  size_t sVar54;
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  long local_d8;
  long local_c0;
  long local_a8;
  
  iVar26 = bottom_blob->elempack;
  uVar39 = (ulong)iVar26;
  pMVar32 = top_blob;
  if ((uVar39 != 0) &&
     (iVar25 = (int)bottom_blob->elemsize << 3,
     pMVar32 = (Mat *)((long)iVar25 % (long)iVar26 & 0xffffffff), iVar25 / iVar26 == 8)) {
    iVar26 = forward_int8(this,bottom_blob,top_blob,opt);
    return iVar26;
  }
  iVar25 = bottom_blob->dims;
  if (iVar25 == 1) {
    if (top_blob == bottom_blob) {
      return 0;
    }
    piVar16 = bottom_blob->refcount;
    if (piVar16 != (int *)0x0) {
      LOCK();
      *piVar16 = *piVar16 + 1;
      UNLOCK();
    }
    piVar16 = top_blob->refcount;
    if (piVar16 != (int *)0x0) {
      LOCK();
      *piVar16 = *piVar16 + -1;
      UNLOCK();
      if (*piVar16 == 0) {
        pAVar17 = top_blob->allocator;
        if (pAVar17 == (Allocator *)0x0) {
          free(top_blob->data);
        }
        else {
          (*pAVar17->_vptr_Allocator[3])(pAVar17,top_blob->data,pMVar32);
        }
      }
    }
    top_blob->cstep = 0;
    top_blob->data = (void *)0x0;
    top_blob->refcount = (int *)0x0;
    *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
    *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
    top_blob->c = 0;
    top_blob->dims = 0;
    top_blob->w = 0;
    top_blob->h = 0;
    top_blob->d = 0;
    piVar16 = bottom_blob->refcount;
    top_blob->data = bottom_blob->data;
    top_blob->refcount = piVar16;
    top_blob->elemsize = bottom_blob->elemsize;
    top_blob->elempack = bottom_blob->elempack;
    top_blob->allocator = bottom_blob->allocator;
    iVar26 = bottom_blob->w;
    iVar25 = bottom_blob->h;
    iVar38 = bottom_blob->d;
    top_blob->dims = bottom_blob->dims;
    top_blob->w = iVar26;
    top_blob->h = iVar25;
    top_blob->d = iVar38;
    top_blob->c = bottom_blob->c;
    top_blob->cstep = bottom_blob->cstep;
    return 0;
  }
  if (opt->use_packing_layout == true) {
    iVar38 = bottom_blob->w;
    lVar46 = (long)iVar38;
    uVar14 = bottom_blob->h;
    uVar15 = bottom_blob->c;
    uVar29 = (ulong)uVar15;
    uVar28 = bottom_blob->elemsize;
    iVar31 = uVar14 * iVar38 * bottom_blob->d;
    uVar36 = uVar15 * iVar26 * iVar31;
    if ((uVar36 & 7) == 0) {
      sVar54 = uVar28 / uVar39 << 3;
      iVar50 = 8;
    }
    else {
      sVar54 = uVar28 / uVar39 << ((uVar36 & 3) == 0) * '\x02';
      if ((uVar36 & 3) != 0) goto LAB_00294fa5;
      iVar50 = 4;
    }
    if (iVar26 == 1 && iVar25 == 2) {
      if (top_blob != bottom_blob) {
        piVar16 = bottom_blob->refcount;
        if (piVar16 != (int *)0x0) {
          LOCK();
          *piVar16 = *piVar16 + 1;
          UNLOCK();
        }
        piVar16 = top_blob->refcount;
        if (piVar16 != (int *)0x0) {
          LOCK();
          *piVar16 = *piVar16 + -1;
          UNLOCK();
          if (*piVar16 == 0) {
            pAVar17 = top_blob->allocator;
            if (pAVar17 == (Allocator *)0x0) {
              free(top_blob->data);
            }
            else {
              (*pAVar17->_vptr_Allocator[3])(pAVar17,top_blob->data,uVar28 % uVar39);
            }
          }
        }
        *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
        *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
        top_blob->data = (void *)0x0;
        top_blob->refcount = (int *)0x0;
        top_blob->c = 0;
        top_blob->dims = 0;
        top_blob->w = 0;
        top_blob->h = 0;
        top_blob->d = 0;
        piVar16 = bottom_blob->refcount;
        top_blob->data = bottom_blob->data;
        top_blob->refcount = piVar16;
        top_blob->allocator = bottom_blob->allocator;
        iVar26 = bottom_blob->c;
        top_blob->d = bottom_blob->d;
        top_blob->c = iVar26;
      }
      top_blob->dims = 1;
      top_blob->w = (int)uVar36 / iVar50;
      top_blob->h = 1;
      top_blob->cstep = (long)((int)uVar36 / iVar50);
      top_blob->elemsize = sVar54;
      top_blob->elempack = iVar50;
    }
    else {
      Mat::create(top_blob,(int)uVar36 / iVar50,sVar54,iVar50,opt->blob_allocator);
      if (top_blob->data == (void *)0x0) {
        return -100;
      }
      if ((long)top_blob->c * top_blob->cstep == 0) {
        return -100;
      }
      if (iVar25 == 2) {
        if (iVar26 == 4) {
          uVar28 = 0;
          uVar39 = (ulong)uVar14;
          if ((int)uVar14 < 1) {
            uVar39 = uVar28;
          }
          lVar41 = lVar46 * 4;
          lVar33 = lVar46 * 0x10;
          lVar53 = lVar46 * 8;
          lVar46 = lVar46 * 0xc;
          for (uVar45 = 0; uVar45 != uVar39; uVar45 = uVar45 + 1) {
            iVar50 = (int)uVar28;
            pvVar18 = top_blob->data;
            lVar40 = bottom_blob->elemsize * uVar45 * (long)bottom_blob->w;
            pvVar19 = bottom_blob->data;
            lVar34 = 0;
            for (iVar51 = 0; iVar51 + 3 < iVar38; iVar51 = iVar51 + 4) {
              auVar2 = *(undefined1 (*) [16])((long)pvVar19 + lVar34 * 4 + lVar40);
              auVar3 = *(undefined1 (*) [16])((long)pvVar19 + lVar34 * 4 + lVar40 + 0x10);
              auVar4 = *(undefined1 (*) [16])((long)pvVar19 + lVar34 * 4 + lVar40 + 0x20);
              auVar5 = *(undefined1 (*) [16])((long)pvVar19 + lVar34 * 4 + lVar40 + 0x30);
              auVar22 = vunpcklps_avx(auVar2,auVar3);
              auVar23 = vunpcklps_avx(auVar4,auVar5);
              auVar21 = vunpckhps_avx(auVar2,auVar3);
              auVar5 = vunpckhps_avx(auVar4,auVar5);
              auVar2 = vmovlhps_avx(auVar22,auVar23);
              auVar4 = vunpckhpd_avx(auVar22,auVar23);
              auVar3 = vmovlhps_avx(auVar21,auVar5);
              auVar5 = vunpckhpd_avx(auVar21,auVar5);
              *(undefined1 (*) [16])((long)pvVar18 + lVar34 + (long)iVar50 * 4) = auVar2;
              *(undefined1 (*) [16])((long)pvVar18 + lVar34 + lVar41) = auVar4;
              *(undefined1 (*) [16])((long)pvVar18 + lVar34 + lVar53) = auVar3;
              *(undefined1 (*) [16])((long)pvVar18 + lVar34 + lVar46) = auVar5;
              lVar34 = lVar34 + 0x10;
            }
            for (; iVar51 < iVar38; iVar51 = iVar51 + 1) {
              *(undefined4 *)((long)pvVar18 + lVar34 + (long)iVar50 * 4) =
                   *(undefined4 *)((long)pvVar19 + lVar34 * 4 + lVar40);
              *(undefined4 *)((long)pvVar18 + lVar34 + lVar41) =
                   *(undefined4 *)((long)pvVar19 + lVar34 * 4 + lVar40 + 4);
              *(undefined4 *)((long)pvVar18 + lVar34 + lVar53) =
                   *(undefined4 *)((long)pvVar19 + lVar34 * 4 + lVar40 + 8);
              *(undefined4 *)((long)pvVar18 + lVar34 + lVar46) =
                   *(undefined4 *)((long)pvVar19 + lVar34 * 4 + lVar40 + 0xc);
              lVar34 = lVar34 + 4;
            }
            lVar41 = lVar41 + lVar33;
            lVar53 = lVar53 + lVar33;
            lVar46 = lVar46 + lVar33;
            uVar28 = (ulong)(uint)(iVar50 + iVar38 * 4);
          }
        }
        else {
          if (iVar26 != 8) {
            return 0;
          }
          uVar36 = 0;
          if ((int)uVar14 < 1) {
            uVar14 = uVar36;
          }
          lVar44 = lVar46 * 0x1c;
          lVar33 = lVar46 * 0x20;
          lVar42 = lVar46 * 0x18;
          lVar48 = lVar46 * 0x14;
          lVar34 = lVar46 << 4;
          lVar40 = lVar46 * 0xc;
          local_a8 = lVar46 * 8;
          lVar41 = lVar46 * 4;
          lVar53 = lVar41;
          for (uVar39 = 0; uVar39 != uVar14; uVar39 = uVar39 + 1) {
            lVar30 = (long)(int)uVar36;
            lVar37 = lVar53 + lVar30 * -4;
            pvVar18 = bottom_blob->data;
            puVar27 = (undefined4 *)
                      (uVar39 * (long)bottom_blob->w * bottom_blob->elemsize + (long)pvVar18);
            pvVar19 = top_blob->data;
            lVar47 = bottom_blob->elemsize * uVar39 * (long)bottom_blob->w;
            lVar43 = 0;
            lVar52 = 0;
            for (iVar50 = 0; iVar50 + 7 < iVar38; iVar50 = iVar50 + 8) {
              auVar6 = *(undefined1 (*) [32])((long)pvVar18 + lVar52 * 8 + lVar47);
              auVar7 = *(undefined1 (*) [32])((long)pvVar18 + lVar52 * 8 + lVar47 + 0x20);
              auVar8 = *(undefined1 (*) [32])((long)pvVar18 + lVar52 * 8 + lVar47 + 0x40);
              auVar9 = *(undefined1 (*) [32])((long)pvVar18 + lVar52 * 8 + lVar47 + 0x60);
              auVar10 = *(undefined1 (*) [32])((long)pvVar18 + lVar52 * 8 + lVar47 + 0x80);
              auVar11 = *(undefined1 (*) [32])((long)pvVar18 + lVar52 * 8 + lVar47 + 0xa0);
              auVar12 = *(undefined1 (*) [32])((long)pvVar18 + lVar52 * 8 + lVar47 + 0xc0);
              auVar13 = *(undefined1 (*) [32])((long)pvVar18 + lVar52 * 8 + lVar47 + 0xe0);
              auVar24 = vunpcklps_avx(auVar6,auVar7);
              auVar7 = vunpckhps_avx(auVar6,auVar7);
              auVar6 = vunpcklps_avx(auVar8,auVar9);
              auVar8 = vunpckhps_avx(auVar8,auVar9);
              auVar55 = vunpcklps_avx(auVar10,auVar11);
              auVar9 = vunpckhps_avx(auVar10,auVar11);
              auVar57 = vunpcklps_avx(auVar12,auVar13);
              auVar10 = vunpckhps_avx(auVar12,auVar13);
              auVar11 = vunpcklpd_avx(auVar24,auVar6);
              auVar6 = vunpckhpd_avx(auVar24,auVar6);
              auVar12 = vunpcklpd_avx(auVar7,auVar8);
              auVar7 = vunpckhpd_avx(auVar7,auVar8);
              auVar13 = vunpcklpd_avx(auVar55,auVar57);
              auVar8 = vunpckhpd_avx(auVar55,auVar57);
              auVar24 = vunpcklpd_avx(auVar9,auVar10);
              auVar9 = vunpckhpd_avx(auVar9,auVar10);
              auVar55._16_16_ = auVar13._0_16_;
              auVar55._0_16_ = auVar11._0_16_;
              auVar57._16_16_ = auVar8._0_16_;
              auVar57._0_16_ = auVar6._0_16_;
              auVar59._16_16_ = auVar24._0_16_;
              auVar59._0_16_ = auVar12._0_16_;
              auVar61._16_16_ = auVar9._0_16_;
              auVar61._0_16_ = auVar7._0_16_;
              auVar10 = vperm2f128_avx(auVar11,auVar13,0x31);
              auVar6 = vperm2f128_avx(auVar6,auVar8,0x31);
              auVar8 = vperm2f128_avx(auVar12,auVar24,0x31);
              auVar7 = vperm2f128_avx(auVar7,auVar9,0x31);
              *(undefined1 (*) [32])((long)pvVar19 + lVar52 + lVar30 * 4) = auVar55;
              *(undefined1 (*) [32])((long)pvVar19 + lVar52 + lVar53) = auVar57;
              *(undefined1 (*) [32])((long)pvVar19 + lVar52 + local_a8) = auVar59;
              *(undefined1 (*) [32])((long)pvVar19 + lVar52 + lVar40) = auVar61;
              *(undefined1 (*) [32])((long)pvVar19 + lVar52 + lVar34) = auVar10;
              *(undefined1 (*) [32])((long)pvVar19 + lVar52 + lVar48) = auVar6;
              *(undefined1 (*) [32])((long)pvVar19 + lVar52 + lVar42) = auVar8;
              *(undefined1 (*) [32])((long)pvVar19 + lVar52 + lVar44) = auVar7;
              puVar27 = puVar27 + 0x40;
              lVar52 = lVar52 + 0x20;
              lVar43 = lVar43 + 8;
            }
            for (; (int)lVar43 < iVar38; lVar43 = lVar43 + 1) {
              puVar1 = (undefined4 *)((long)pvVar19 + lVar43 * 4 + lVar30 * 4);
              *puVar1 = *puVar27;
              *(undefined4 *)((long)puVar1 + lVar37) = puVar27[1];
              *(undefined4 *)((long)puVar1 + lVar41 + lVar37) = puVar27[2];
              *(undefined4 *)((long)puVar1 + lVar41 + lVar41 + lVar37) = puVar27[3];
              lVar47 = lVar41 + lVar41 + lVar37;
              *(undefined4 *)((long)puVar1 + lVar41 + lVar47) = puVar27[4];
              lVar47 = lVar41 + lVar47;
              *(undefined4 *)((long)puVar1 + lVar41 + lVar47) = puVar27[5];
              lVar47 = lVar41 + lVar47;
              *(undefined4 *)((long)puVar1 + lVar41 + lVar47) = puVar27[6];
              *(undefined4 *)((long)puVar1 + lVar46 * 8 + lVar47) = puVar27[7];
              puVar27 = puVar27 + 8;
            }
            lVar44 = lVar44 + lVar33;
            lVar42 = lVar42 + lVar33;
            lVar48 = lVar48 + lVar33;
            lVar34 = lVar34 + lVar33;
            lVar40 = lVar40 + lVar33;
            local_a8 = local_a8 + lVar33;
            lVar53 = lVar53 + lVar33;
            uVar36 = uVar36 + iVar38 * 8;
          }
        }
      }
      if (1 < iVar25 - 3U) {
        return 0;
      }
      lVar46 = (long)iVar31;
      if (iVar26 == 4) {
        iVar25 = 0;
        uVar39 = 0;
        if (0 < (int)uVar15) {
          uVar39 = uVar29;
        }
        lVar41 = lVar46 * 4;
        lVar33 = lVar46 * 0x10;
        lVar53 = lVar46 * 8;
        lVar34 = lVar46 * 0xc;
        for (uVar28 = 0; uVar28 != uVar39; uVar28 = uVar28 + 1) {
          pvVar18 = top_blob->data;
          lVar40 = bottom_blob->elemsize * bottom_blob->cstep * uVar28;
          pvVar19 = bottom_blob->data;
          lVar42 = 0;
          for (iVar38 = 0; iVar38 + 3 < iVar31; iVar38 = iVar38 + 4) {
            auVar2 = *(undefined1 (*) [16])((long)pvVar19 + lVar42 * 4 + lVar40);
            auVar3 = *(undefined1 (*) [16])((long)pvVar19 + lVar42 * 4 + lVar40 + 0x10);
            auVar4 = *(undefined1 (*) [16])((long)pvVar19 + lVar42 * 4 + lVar40 + 0x20);
            auVar5 = *(undefined1 (*) [16])((long)pvVar19 + lVar42 * 4 + lVar40 + 0x30);
            auVar22 = vunpcklps_avx(auVar2,auVar3);
            auVar23 = vunpcklps_avx(auVar4,auVar5);
            auVar21 = vunpckhps_avx(auVar2,auVar3);
            auVar5 = vunpckhps_avx(auVar4,auVar5);
            auVar2 = vmovlhps_avx(auVar22,auVar23);
            auVar4 = vunpckhpd_avx(auVar22,auVar23);
            auVar3 = vmovlhps_avx(auVar21,auVar5);
            auVar5 = vunpckhpd_avx(auVar21,auVar5);
            *(undefined1 (*) [16])((long)pvVar18 + lVar42 + (long)iVar25 * 4) = auVar2;
            *(undefined1 (*) [16])((long)pvVar18 + lVar42 + lVar41) = auVar4;
            *(undefined1 (*) [16])((long)pvVar18 + lVar42 + lVar53) = auVar3;
            *(undefined1 (*) [16])((long)pvVar18 + lVar42 + lVar34) = auVar5;
            lVar42 = lVar42 + 0x10;
          }
          for (; iVar38 < iVar31; iVar38 = iVar38 + 1) {
            *(undefined4 *)((long)pvVar18 + lVar42 + (long)iVar25 * 4) =
                 *(undefined4 *)((long)pvVar19 + lVar42 * 4 + lVar40);
            *(undefined4 *)((long)pvVar18 + lVar42 + lVar41) =
                 *(undefined4 *)((long)pvVar19 + lVar42 * 4 + lVar40 + 4);
            *(undefined4 *)((long)pvVar18 + lVar42 + lVar53) =
                 *(undefined4 *)((long)pvVar19 + lVar42 * 4 + lVar40 + 8);
            *(undefined4 *)((long)pvVar18 + lVar42 + lVar34) =
                 *(undefined4 *)((long)pvVar19 + lVar42 * 4 + lVar40 + 0xc);
            lVar42 = lVar42 + 4;
          }
          iVar25 = iVar25 + iVar31 * 4;
          lVar41 = lVar41 + lVar33;
          lVar53 = lVar53 + lVar33;
          lVar34 = lVar34 + lVar33;
        }
      }
      else if (iVar26 == 8) {
        iVar25 = 0;
        uVar39 = 0;
        if (0 < (int)uVar15) {
          uVar39 = uVar29;
        }
        lVar41 = lVar46 * 4;
        lVar34 = lVar46 * 0x20;
        lVar53 = lVar46 * 8;
        lVar40 = lVar46 * 0xc;
        lVar33 = lVar46 << 4;
        lVar42 = lVar46 * 0x14;
        local_d8 = lVar46 * 0x18;
        local_c0 = lVar46 * 0x1c;
        for (uVar28 = 0; uVar28 != uVar39; uVar28 = uVar28 + 1) {
          pvVar18 = top_blob->data;
          lVar44 = bottom_blob->elemsize * bottom_blob->cstep * uVar28;
          pvVar19 = bottom_blob->data;
          lVar48 = 0;
          for (iVar38 = 0; iVar38 + 7 < iVar31; iVar38 = iVar38 + 8) {
            auVar6 = *(undefined1 (*) [32])((long)pvVar19 + lVar48 * 8 + lVar44);
            auVar7 = *(undefined1 (*) [32])((long)pvVar19 + lVar48 * 8 + lVar44 + 0x20);
            auVar8 = *(undefined1 (*) [32])((long)pvVar19 + lVar48 * 8 + lVar44 + 0x40);
            auVar9 = *(undefined1 (*) [32])((long)pvVar19 + lVar48 * 8 + lVar44 + 0x60);
            auVar10 = *(undefined1 (*) [32])((long)pvVar19 + lVar48 * 8 + lVar44 + 0x80);
            auVar11 = *(undefined1 (*) [32])((long)pvVar19 + lVar48 * 8 + lVar44 + 0xa0);
            auVar12 = *(undefined1 (*) [32])((long)pvVar19 + lVar48 * 8 + lVar44 + 0xc0);
            auVar13 = *(undefined1 (*) [32])((long)pvVar19 + lVar48 * 8 + lVar44 + 0xe0);
            auVar24 = vunpcklps_avx(auVar6,auVar7);
            auVar7 = vunpckhps_avx(auVar6,auVar7);
            auVar6 = vunpcklps_avx(auVar8,auVar9);
            auVar8 = vunpckhps_avx(auVar8,auVar9);
            auVar55 = vunpcklps_avx(auVar10,auVar11);
            auVar9 = vunpckhps_avx(auVar10,auVar11);
            auVar57 = vunpcklps_avx(auVar12,auVar13);
            auVar10 = vunpckhps_avx(auVar12,auVar13);
            auVar11 = vunpcklpd_avx(auVar24,auVar6);
            auVar6 = vunpckhpd_avx(auVar24,auVar6);
            auVar12 = vunpcklpd_avx(auVar7,auVar8);
            auVar7 = vunpckhpd_avx(auVar7,auVar8);
            auVar13 = vunpcklpd_avx(auVar55,auVar57);
            auVar8 = vunpckhpd_avx(auVar55,auVar57);
            auVar24 = vunpcklpd_avx(auVar9,auVar10);
            auVar9 = vunpckhpd_avx(auVar9,auVar10);
            auVar56._16_16_ = auVar13._0_16_;
            auVar56._0_16_ = auVar11._0_16_;
            auVar58._16_16_ = auVar8._0_16_;
            auVar58._0_16_ = auVar6._0_16_;
            auVar60._16_16_ = auVar24._0_16_;
            auVar60._0_16_ = auVar12._0_16_;
            auVar62._16_16_ = auVar9._0_16_;
            auVar62._0_16_ = auVar7._0_16_;
            auVar10 = vperm2f128_avx(auVar11,auVar13,0x31);
            auVar6 = vperm2f128_avx(auVar6,auVar8,0x31);
            auVar8 = vperm2f128_avx(auVar12,auVar24,0x31);
            auVar7 = vperm2f128_avx(auVar7,auVar9,0x31);
            *(undefined1 (*) [32])((long)pvVar18 + lVar48 + (long)iVar25 * 4) = auVar56;
            *(undefined1 (*) [32])((long)pvVar18 + lVar48 + lVar41) = auVar58;
            *(undefined1 (*) [32])((long)pvVar18 + lVar48 + lVar53) = auVar60;
            *(undefined1 (*) [32])((long)pvVar18 + lVar48 + lVar40) = auVar62;
            *(undefined1 (*) [32])((long)pvVar18 + lVar48 + lVar33) = auVar10;
            *(undefined1 (*) [32])((long)pvVar18 + lVar48 + lVar42) = auVar6;
            *(undefined1 (*) [32])((long)pvVar18 + lVar48 + local_d8) = auVar8;
            *(undefined1 (*) [32])((long)pvVar18 + lVar48 + local_c0) = auVar7;
            lVar48 = lVar48 + 0x20;
          }
          for (; iVar38 < iVar31; iVar38 = iVar38 + 1) {
            *(undefined4 *)((long)pvVar18 + lVar48 + (long)iVar25 * 4) =
                 *(undefined4 *)((long)pvVar19 + lVar48 * 8 + lVar44);
            *(undefined4 *)((long)pvVar18 + lVar48 + lVar41) =
                 *(undefined4 *)((long)pvVar19 + lVar48 * 8 + lVar44 + 4);
            *(undefined4 *)((long)pvVar18 + lVar48 + lVar53) =
                 *(undefined4 *)((long)pvVar19 + lVar48 * 8 + lVar44 + 8);
            *(undefined4 *)((long)pvVar18 + lVar48 + lVar40) =
                 *(undefined4 *)((long)pvVar19 + lVar48 * 8 + lVar44 + 0xc);
            *(undefined4 *)((long)pvVar18 + lVar48 + lVar33) =
                 *(undefined4 *)((long)pvVar19 + lVar48 * 8 + lVar44 + 0x10);
            *(undefined4 *)((long)pvVar18 + lVar48 + lVar42) =
                 *(undefined4 *)((long)pvVar19 + lVar48 * 8 + lVar44 + 0x14);
            *(undefined4 *)((long)pvVar18 + lVar48 + local_d8) =
                 *(undefined4 *)((long)pvVar19 + lVar48 * 8 + lVar44 + 0x18);
            *(undefined4 *)((long)pvVar18 + lVar48 + local_c0) =
                 *(undefined4 *)((long)pvVar19 + lVar48 * 8 + lVar44 + 0x1c);
            lVar48 = lVar48 + 4;
          }
          iVar25 = iVar25 + iVar31 * 8;
          lVar41 = lVar41 + lVar34;
          lVar53 = lVar53 + lVar34;
          lVar40 = lVar40 + lVar34;
          lVar33 = lVar33 + lVar34;
          lVar42 = lVar42 + lVar34;
          local_d8 = local_d8 + lVar34;
          local_c0 = local_c0 + lVar34;
        }
      }
      if (iVar26 != 1) {
        return 0;
      }
      if ((int)uVar15 < 1) {
        uVar29 = 0;
      }
      lVar41 = 0;
      for (uVar39 = 0; uVar39 != uVar29; uVar39 = uVar39 + 1) {
        pvVar18 = bottom_blob->data;
        sVar54 = bottom_blob->elemsize;
        sVar20 = bottom_blob->cstep;
        pauVar49 = (undefined1 (*) [32])(sVar20 * uVar39 * sVar54 + (long)pvVar18);
        pvVar19 = top_blob->data;
        pauVar35 = (undefined1 (*) [32])((long)pvVar19 + uVar39 * lVar46 * 4);
        lVar53 = 0;
        for (iVar26 = 0; iVar26 + 7 < iVar31; iVar26 = iVar26 + 8) {
          *pauVar35 = *pauVar49;
          pauVar49 = pauVar49 + 1;
          pauVar35 = pauVar35 + 1;
          lVar53 = lVar53 + 8;
        }
        for (; (int)lVar53 < iVar31; lVar53 = lVar53 + 1) {
          *(undefined4 *)((long)pvVar19 + lVar53 * 4 + lVar41) =
               *(undefined4 *)((long)pvVar18 + lVar53 * 4 + sVar20 * sVar54 * uVar39);
        }
        lVar41 = lVar41 + lVar46 * 4;
      }
    }
    return 0;
  }
LAB_00294fa5:
  iVar26 = Flatten::forward((Flatten *)
                            ((long)&this->_vptr_Flatten_x86_avx +
                            (long)this->_vptr_Flatten_x86_avx[-3]),bottom_blob,top_blob,opt);
  return iVar26;
}

Assistant:

int Flatten_x86_avx::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int elembits = bottom_blob.elembits();

    if (elembits == 8)
        return forward_int8(bottom_blob, top_blob, opt);

    int dims = bottom_blob.dims;

    if (dims == 1)
    {
        top_blob = bottom_blob;
        return 0;
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;
    int size = w * h * d;

    int total = size * channels * elempack;

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = total % 16 == 0 ? 16 : total % 8 == 0 ? 8 : total % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = total % 8 == 0 ? 8 : total % 4 == 0 ? 4 : 1;
#else
        out_elempack = total % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    if (out_elempack == 1)
    {
        return Flatten::forward(bottom_blob, top_blob, opt);
    }

    if (dims == 2 && elempack == 1) // out_elempack == 4 || out_elempack == 8 || out_elempack == 16
    {
        top_blob = bottom_blob;
        top_blob.dims = 1;
        top_blob.w = total / out_elempack;
        top_blob.h = 1;
        top_blob.cstep = top_blob.w;
        top_blob.elemsize = out_elemsize;
        top_blob.elempack = out_elempack;
        return 0;
    }

    top_blob.create(total / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (dims == 2)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16) // out_elempack == 16
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const float* ptr = bottom_blob.row(i);
                float* outptr0 = (float*)top_blob + w * i * 16;
                float* outptr1 = (float*)top_blob + w * (i * 16 + 1);
                float* outptr2 = (float*)top_blob + w * (i * 16 + 2);
                float* outptr3 = (float*)top_blob + w * (i * 16 + 3);
                float* outptr4 = (float*)top_blob + w * (i * 16 + 4);
                float* outptr5 = (float*)top_blob + w * (i * 16 + 5);
                float* outptr6 = (float*)top_blob + w * (i * 16 + 6);
                float* outptr7 = (float*)top_blob + w * (i * 16 + 7);
                float* outptr8 = (float*)top_blob + w * (i * 16 + 8);
                float* outptr9 = (float*)top_blob + w * (i * 16 + 9);
                float* outptra = (float*)top_blob + w * (i * 16 + 10);
                float* outptrb = (float*)top_blob + w * (i * 16 + 11);
                float* outptrc = (float*)top_blob + w * (i * 16 + 12);
                float* outptrd = (float*)top_blob + w * (i * 16 + 13);
                float* outptre = (float*)top_blob + w * (i * 16 + 14);
                float* outptrf = (float*)top_blob + w * (i * 16 + 15);

                int j = 0;
                for (; j + 15 < w; j += 16)
                {
                    __m512 _r0 = _mm512_loadu_ps(ptr);
                    __m512 _r1 = _mm512_loadu_ps(ptr + 16);
                    __m512 _r2 = _mm512_loadu_ps(ptr + 16 * 2);
                    __m512 _r3 = _mm512_loadu_ps(ptr + 16 * 3);
                    __m512 _r4 = _mm512_loadu_ps(ptr + 16 * 4);
                    __m512 _r5 = _mm512_loadu_ps(ptr + 16 * 5);
                    __m512 _r6 = _mm512_loadu_ps(ptr + 16 * 6);
                    __m512 _r7 = _mm512_loadu_ps(ptr + 16 * 7);
                    __m512 _r8 = _mm512_loadu_ps(ptr + 16 * 8);
                    __m512 _r9 = _mm512_loadu_ps(ptr + 16 * 9);
                    __m512 _ra = _mm512_loadu_ps(ptr + 16 * 10);
                    __m512 _rb = _mm512_loadu_ps(ptr + 16 * 11);
                    __m512 _rc = _mm512_loadu_ps(ptr + 16 * 12);
                    __m512 _rd = _mm512_loadu_ps(ptr + 16 * 13);
                    __m512 _re = _mm512_loadu_ps(ptr + 16 * 14);
                    __m512 _rf = _mm512_loadu_ps(ptr + 16 * 15);

                    transpose16_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7, _r8, _r9, _ra, _rb, _rc, _rd, _re, _rf);

                    _mm512_storeu_ps(outptr0, _r0);
                    _mm512_storeu_ps(outptr1, _r1);
                    _mm512_storeu_ps(outptr2, _r2);
                    _mm512_storeu_ps(outptr3, _r3);
                    _mm512_storeu_ps(outptr4, _r4);
                    _mm512_storeu_ps(outptr5, _r5);
                    _mm512_storeu_ps(outptr6, _r6);
                    _mm512_storeu_ps(outptr7, _r7);
                    _mm512_storeu_ps(outptr8, _r8);
                    _mm512_storeu_ps(outptr9, _r9);
                    _mm512_storeu_ps(outptra, _ra);
                    _mm512_storeu_ps(outptrb, _rb);
                    _mm512_storeu_ps(outptrc, _rc);
                    _mm512_storeu_ps(outptrd, _rd);
                    _mm512_storeu_ps(outptre, _re);
                    _mm512_storeu_ps(outptrf, _rf);

                    outptr0 += 16;
                    outptr1 += 16;
                    outptr2 += 16;
                    outptr3 += 16;
                    outptr4 += 16;
                    outptr5 += 16;
                    outptr6 += 16;
                    outptr7 += 16;
                    outptr8 += 16;
                    outptr9 += 16;
                    outptra += 16;
                    outptrb += 16;
                    outptrc += 16;
                    outptrd += 16;
                    outptre += 16;
                    outptrf += 16;
                    ptr += 256;
                }
                for (; j < w; j++)
                {
                    *outptr0++ = ptr[0];
                    *outptr1++ = ptr[1];
                    *outptr2++ = ptr[2];
                    *outptr3++ = ptr[3];
                    *outptr4++ = ptr[4];
                    *outptr5++ = ptr[5];
                    *outptr6++ = ptr[6];
                    *outptr7++ = ptr[7];
                    *outptr8++ = ptr[8];
                    *outptr9++ = ptr[9];
                    *outptra++ = ptr[10];
                    *outptrb++ = ptr[11];
                    *outptrc++ = ptr[12];
                    *outptrd++ = ptr[13];
                    *outptre++ = ptr[14];
                    *outptrf++ = ptr[15];

                    ptr += 16;
                }
            }
        }
#endif // __AVX512F__

        if (elempack == 8) // out_elempack == 8 || out_elempack == 16
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const float* ptr = bottom_blob.row(i);
                float* outptr0 = (float*)top_blob + w * i * 8;
                float* outptr1 = (float*)top_blob + w * (i * 8 + 1);
                float* outptr2 = (float*)top_blob + w * (i * 8 + 2);
                float* outptr3 = (float*)top_blob + w * (i * 8 + 3);
                float* outptr4 = (float*)top_blob + w * (i * 8 + 4);
                float* outptr5 = (float*)top_blob + w * (i * 8 + 5);
                float* outptr6 = (float*)top_blob + w * (i * 8 + 6);
                float* outptr7 = (float*)top_blob + w * (i * 8 + 7);

                int j = 0;
                for (; j + 7 < w; j += 8)
                {
                    __m256 _row0 = _mm256_loadu_ps(ptr);
                    __m256 _row1 = _mm256_loadu_ps(ptr + 8);
                    __m256 _row2 = _mm256_loadu_ps(ptr + 16);
                    __m256 _row3 = _mm256_loadu_ps(ptr + 24);
                    __m256 _row4 = _mm256_loadu_ps(ptr + 32);
                    __m256 _row5 = _mm256_loadu_ps(ptr + 40);
                    __m256 _row6 = _mm256_loadu_ps(ptr + 48);
                    __m256 _row7 = _mm256_loadu_ps(ptr + 56);

                    transpose8_ps(_row0, _row1, _row2, _row3, _row4, _row5, _row6, _row7);

                    _mm256_storeu_ps(outptr0, _row0);
                    _mm256_storeu_ps(outptr1, _row1);
                    _mm256_storeu_ps(outptr2, _row2);
                    _mm256_storeu_ps(outptr3, _row3);
                    _mm256_storeu_ps(outptr4, _row4);
                    _mm256_storeu_ps(outptr5, _row5);
                    _mm256_storeu_ps(outptr6, _row6);
                    _mm256_storeu_ps(outptr7, _row7);

                    outptr0 += 8;
                    outptr1 += 8;
                    outptr2 += 8;
                    outptr3 += 8;
                    outptr4 += 8;
                    outptr5 += 8;
                    outptr6 += 8;
                    outptr7 += 8;
                    ptr += 64;
                }
                for (; j < w; j++)
                {
                    *outptr0++ = ptr[0];
                    *outptr1++ = ptr[1];
                    *outptr2++ = ptr[2];
                    *outptr3++ = ptr[3];
                    *outptr4++ = ptr[4];
                    *outptr5++ = ptr[5];
                    *outptr6++ = ptr[6];
                    *outptr7++ = ptr[7];

                    ptr += 8;
                }
            }
        }
#endif // __AVX__

        if (elempack == 4) // out_elempack == 4 || out_elempack == 8 || out_elempack == 16
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const float* ptr = bottom_blob.row(i);
                float* outptr0 = (float*)top_blob + w * i * 4;
                float* outptr1 = (float*)top_blob + w * (i * 4 + 1);
                float* outptr2 = (float*)top_blob + w * (i * 4 + 2);
                float* outptr3 = (float*)top_blob + w * (i * 4 + 3);

                int j = 0;
                for (; j + 3 < w; j += 4)
                {
                    __m128 _row0 = _mm_loadu_ps(ptr);
                    __m128 _row1 = _mm_loadu_ps(ptr + 4);
                    __m128 _row2 = _mm_loadu_ps(ptr + 8);
                    __m128 _row3 = _mm_loadu_ps(ptr + 12);

                    _MM_TRANSPOSE4_PS(_row0, _row1, _row2, _row3);

                    _mm_storeu_ps(outptr0, _row0);
                    _mm_storeu_ps(outptr1, _row1);
                    _mm_storeu_ps(outptr2, _row2);
                    _mm_storeu_ps(outptr3, _row3);

                    ptr += 16;
                    outptr0 += 4;
                    outptr1 += 4;
                    outptr2 += 4;
                    outptr3 += 4;
                }
                for (; j < w; j++)
                {
                    *outptr0++ = ptr[0];
                    *outptr1++ = ptr[1];
                    *outptr2++ = ptr[2];
                    *outptr3++ = ptr[3];

                    ptr += 4;
                }
            }
        }
#endif // __SSE2__
    }

    if (dims == 3 || dims == 4)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16) // out_elempack == 16
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                float* outptr0 = (float*)top_blob + size * q * 16;
                float* outptr1 = (float*)top_blob + size * (q * 16 + 1);
                float* outptr2 = (float*)top_blob + size * (q * 16 + 2);
                float* outptr3 = (float*)top_blob + size * (q * 16 + 3);
                float* outptr4 = (float*)top_blob + size * (q * 16 + 4);
                float* outptr5 = (float*)top_blob + size * (q * 16 + 5);
                float* outptr6 = (float*)top_blob + size * (q * 16 + 6);
                float* outptr7 = (float*)top_blob + size * (q * 16 + 7);
                float* outptr8 = (float*)top_blob + size * (q * 16 + 8);
                float* outptr9 = (float*)top_blob + size * (q * 16 + 9);
                float* outptra = (float*)top_blob + size * (q * 16 + 10);
                float* outptrb = (float*)top_blob + size * (q * 16 + 11);
                float* outptrc = (float*)top_blob + size * (q * 16 + 12);
                float* outptrd = (float*)top_blob + size * (q * 16 + 13);
                float* outptre = (float*)top_blob + size * (q * 16 + 14);
                float* outptrf = (float*)top_blob + size * (q * 16 + 15);

                int i = 0;
                for (; i + 15 < size; i += 16)
                {
                    __m512 _r0 = _mm512_loadu_ps(ptr);
                    __m512 _r1 = _mm512_loadu_ps(ptr + 16);
                    __m512 _r2 = _mm512_loadu_ps(ptr + 16 * 2);
                    __m512 _r3 = _mm512_loadu_ps(ptr + 16 * 3);
                    __m512 _r4 = _mm512_loadu_ps(ptr + 16 * 4);
                    __m512 _r5 = _mm512_loadu_ps(ptr + 16 * 5);
                    __m512 _r6 = _mm512_loadu_ps(ptr + 16 * 6);
                    __m512 _r7 = _mm512_loadu_ps(ptr + 16 * 7);
                    __m512 _r8 = _mm512_loadu_ps(ptr + 16 * 8);
                    __m512 _r9 = _mm512_loadu_ps(ptr + 16 * 9);
                    __m512 _ra = _mm512_loadu_ps(ptr + 16 * 10);
                    __m512 _rb = _mm512_loadu_ps(ptr + 16 * 11);
                    __m512 _rc = _mm512_loadu_ps(ptr + 16 * 12);
                    __m512 _rd = _mm512_loadu_ps(ptr + 16 * 13);
                    __m512 _re = _mm512_loadu_ps(ptr + 16 * 14);
                    __m512 _rf = _mm512_loadu_ps(ptr + 16 * 15);

                    transpose16_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7, _r8, _r9, _ra, _rb, _rc, _rd, _re, _rf);

                    _mm512_storeu_ps(outptr0, _r0);
                    _mm512_storeu_ps(outptr1, _r1);
                    _mm512_storeu_ps(outptr2, _r2);
                    _mm512_storeu_ps(outptr3, _r3);
                    _mm512_storeu_ps(outptr4, _r4);
                    _mm512_storeu_ps(outptr5, _r5);
                    _mm512_storeu_ps(outptr6, _r6);
                    _mm512_storeu_ps(outptr7, _r7);
                    _mm512_storeu_ps(outptr8, _r8);
                    _mm512_storeu_ps(outptr9, _r9);
                    _mm512_storeu_ps(outptra, _ra);
                    _mm512_storeu_ps(outptrb, _rb);
                    _mm512_storeu_ps(outptrc, _rc);
                    _mm512_storeu_ps(outptrd, _rd);
                    _mm512_storeu_ps(outptre, _re);
                    _mm512_storeu_ps(outptrf, _rf);

                    outptr0 += 16;
                    outptr1 += 16;
                    outptr2 += 16;
                    outptr3 += 16;
                    outptr4 += 16;
                    outptr5 += 16;
                    outptr6 += 16;
                    outptr7 += 16;
                    outptr8 += 16;
                    outptr9 += 16;
                    outptra += 16;
                    outptrb += 16;
                    outptrc += 16;
                    outptrd += 16;
                    outptre += 16;
                    outptrf += 16;
                    ptr += 256;
                }
                for (; i < size; i++)
                {
                    *outptr0++ = ptr[0];
                    *outptr1++ = ptr[1];
                    *outptr2++ = ptr[2];
                    *outptr3++ = ptr[3];
                    *outptr4++ = ptr[4];
                    *outptr5++ = ptr[5];
                    *outptr6++ = ptr[6];
                    *outptr7++ = ptr[7];
                    *outptr8++ = ptr[8];
                    *outptr9++ = ptr[9];
                    *outptra++ = ptr[10];
                    *outptrb++ = ptr[11];
                    *outptrc++ = ptr[12];
                    *outptrd++ = ptr[13];
                    *outptre++ = ptr[14];
                    *outptrf++ = ptr[15];

                    ptr += 16;
                }
            }
        }
#endif // __AVX512F__

        if (elempack == 8) // out_elempack == 8 || out_elempack == 16
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                float* outptr0 = (float*)top_blob + size * q * 8;
                float* outptr1 = (float*)top_blob + size * (q * 8 + 1);
                float* outptr2 = (float*)top_blob + size * (q * 8 + 2);
                float* outptr3 = (float*)top_blob + size * (q * 8 + 3);
                float* outptr4 = (float*)top_blob + size * (q * 8 + 4);
                float* outptr5 = (float*)top_blob + size * (q * 8 + 5);
                float* outptr6 = (float*)top_blob + size * (q * 8 + 6);
                float* outptr7 = (float*)top_blob + size * (q * 8 + 7);

                int i = 0;
                for (; i + 7 < size; i += 8)
                {
                    __m256 _row0 = _mm256_loadu_ps(ptr);
                    __m256 _row1 = _mm256_loadu_ps(ptr + 8);
                    __m256 _row2 = _mm256_loadu_ps(ptr + 16);
                    __m256 _row3 = _mm256_loadu_ps(ptr + 24);
                    __m256 _row4 = _mm256_loadu_ps(ptr + 32);
                    __m256 _row5 = _mm256_loadu_ps(ptr + 40);
                    __m256 _row6 = _mm256_loadu_ps(ptr + 48);
                    __m256 _row7 = _mm256_loadu_ps(ptr + 56);

                    transpose8_ps(_row0, _row1, _row2, _row3, _row4, _row5, _row6, _row7);

                    _mm256_storeu_ps(outptr0, _row0);
                    _mm256_storeu_ps(outptr1, _row1);
                    _mm256_storeu_ps(outptr2, _row2);
                    _mm256_storeu_ps(outptr3, _row3);
                    _mm256_storeu_ps(outptr4, _row4);
                    _mm256_storeu_ps(outptr5, _row5);
                    _mm256_storeu_ps(outptr6, _row6);
                    _mm256_storeu_ps(outptr7, _row7);

                    outptr0 += 8;
                    outptr1 += 8;
                    outptr2 += 8;
                    outptr3 += 8;
                    outptr4 += 8;
                    outptr5 += 8;
                    outptr6 += 8;
                    outptr7 += 8;
                    ptr += 64;
                }
                for (; i < size; i++)
                {
                    *outptr0++ = ptr[0];
                    *outptr1++ = ptr[1];
                    *outptr2++ = ptr[2];
                    *outptr3++ = ptr[3];
                    *outptr4++ = ptr[4];
                    *outptr5++ = ptr[5];
                    *outptr6++ = ptr[6];
                    *outptr7++ = ptr[7];

                    ptr += 8;
                }
            }
        }
#endif // __AVX__

        if (elempack == 4) // out_elempack == 4 || out_elempack == 8 || out_elempack == 16
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                float* outptr0 = (float*)top_blob + size * q * 4;
                float* outptr1 = (float*)top_blob + size * (q * 4 + 1);
                float* outptr2 = (float*)top_blob + size * (q * 4 + 2);
                float* outptr3 = (float*)top_blob + size * (q * 4 + 3);

                int i = 0;
                for (; i + 3 < size; i += 4)
                {
                    __m128 _row0 = _mm_loadu_ps(ptr);
                    __m128 _row1 = _mm_loadu_ps(ptr + 4);
                    __m128 _row2 = _mm_loadu_ps(ptr + 8);
                    __m128 _row3 = _mm_loadu_ps(ptr + 12);

                    _MM_TRANSPOSE4_PS(_row0, _row1, _row2, _row3);

                    _mm_storeu_ps(outptr0, _row0);
                    _mm_storeu_ps(outptr1, _row1);
                    _mm_storeu_ps(outptr2, _row2);
                    _mm_storeu_ps(outptr3, _row3);

                    ptr += 16;
                    outptr0 += 4;
                    outptr1 += 4;
                    outptr2 += 4;
                    outptr3 += 4;
                }
                for (; i < size; i++)
                {
                    *outptr0++ = ptr[0];
                    *outptr1++ = ptr[1];
                    *outptr2++ = ptr[2];
                    *outptr3++ = ptr[3];

                    ptr += 4;
                }
            }
        }
#endif // __SSE2__

        if (elempack == 1) // out_elempack == 4 || out_elempack == 8 || out_elempack == 16
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                float* outptr = (float*)top_blob + size * q;

                int i = 0;
#if __AVX__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _v = _mm256_loadu_ps(ptr);
                    _mm256_storeu_ps(outptr, _v);
                    ptr += 8;
                    outptr += 8;
                }
#endif
                for (; i < size; i++)
                {
                    *outptr++ = *ptr++;
                }
            }
        }
    }

    return 0;
}